

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugManager.cpp
# Opt level: O0

void __thiscall Js::DebugManager::Close(DebugManager *this)

{
  DynamicObject *pDVar1;
  Recycler *recycler;
  DebugManager *this_local;
  
  Memory::
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::Close(&this->diagnosticPageAllocator);
  pDVar1 = Memory::RecyclerRootPtr::operator_cast_to_DynamicObject_
                     ((RecyclerRootPtr *)&this->pConsoleScope);
  if (pDVar1 != (DynamicObject *)0x0) {
    recycler = ThreadContext::GetRecycler(this->pThreadContext);
    Memory::RecyclerRootPtr<Js::DynamicObject>::Unroot(&this->pConsoleScope,recycler);
  }
  ThreadContext::EnsureNoReturnedValueList(this->pThreadContext);
  this->pThreadContext = (ThreadContext *)0x0;
  return;
}

Assistant:

void DebugManager::Close()
    {
        this->diagnosticPageAllocator.Close();

        if (this->pConsoleScope)
        {
            this->pConsoleScope.Unroot(this->pThreadContext->GetRecycler());
        }
#if DBG
        this->pThreadContext->EnsureNoReturnedValueList();
#endif
        this->pThreadContext = nullptr;
    }